

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

void __thiscall
webfront::msg::FunctionCall::
encodeParameter<std::__cxx11::string&,webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
          (FunctionCall *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          Frame<webfront::networking::TCPNetworkingTS> *frame)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  uint8_t uVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  size_t sVar5;
  anon_class_24_3_42224fb6 *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  FunctionCall *in_RDI;
  anon_class_24_3_42224fb6 encodeString;
  anon_class_8_1_8991fb9c encodeType;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  char *str;
  FunctionCall *in_stack_ffffffffffffffb8;
  char local_40 [8];
  string_view local_38;
  string_view local_28;
  anon_class_24_3_42224fb6 *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = getParametersCount(in_RDI);
  setParametersCount(in_RDI,uVar1 + '\x01');
  poVar2 = std::operator<<((ostream *)&std::cout,"Param: ");
  local_28 = typeName<std::__cxx11::string&>(in_stack_ffffffffffffffb8);
  __str._M_str = in_stack_ffffffffffffff90;
  __str._M_len = in_stack_ffffffffffffff88;
  pbVar3 = std::operator<<(poVar2,__str);
  poVar4 = std::operator<<(pbVar3," -> ");
  local_38 = typeName<std::__cxx11::string>(in_stack_ffffffffffffffb8);
  __str_00._M_str = in_stack_ffffffffffffff90;
  __str_00._M_len = (size_t)poVar4;
  pbVar3 = std::operator<<(poVar2,__str_00);
  poVar2 = std::operator<<(pbVar3," : ");
  poVar2 = std::operator<<(poVar2,(string *)local_10);
  std::operator<<(poVar2,"\n");
  str = local_40;
  http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147362);
  http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (local_10);
  encodeParameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>_>
  ::anon_class_24_3_42224fb6::operator()(local_18,str,in_stack_ffffffffffffffa0);
  poVar2 = std::operator<<((ostream *)&std::cout,"bufferIndex = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI->encodeBufferIndex);
  poVar2 = std::operator<<(poVar2," ,payloadSize = ");
  sVar5 = getPayloadSize(in_RDI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void encodeParameter(T&& t, WebSocketFrame& frame) {
        using namespace std;
        using ParamType = remove_cvref_t<T>;
        setParametersCount(getParametersCount() + 1);

        if constexpr (is_printable<T>::value) {
            std::cout << "Param: " << typeName<T>() << " -> " << typeName<ParamType>() << " : " << t << "\n";
        }

        [[maybe_unused]] auto encodeType = [&, this](msg::CodedType type, auto size, WebSocketFrame& wsFrame) {
            wsFrame.addBuffer(std::span(&buffer[encodeBufferIndex], 1 + sizeof(size)));
            buffer[encodeBufferIndex++] = static_cast<std::byte>(type);
            std::copy_n(reinterpret_cast<const std::byte*>(&size), sizeof(size), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(size);
            incrementPayloadSize(1 + sizeof(size));
        };

        [[maybe_unused]] auto encodeString = [&](const char* str, size_t size) constexpr {
            if (size < 256)
                encodeType(msg::CodedType::smallString, static_cast<uint8_t>(size), frame);
            else
                encodeType(msg::CodedType::string, static_cast<uint16_t>(size), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(str), size));
            incrementPayloadSize(size);

            std::cout << "-> encoded to string of size " << size << " in a span.\n";
        };

        if constexpr (is_tuple_v<ParamType>) {
            uint8_t nbParams = static_cast<uint8_t>(tuple_size<ParamType>::value);
            encodeType(msg::CodedType::tuple, nbParams, frame);
            std::apply([&](auto&... tupleArgs) { ((encodeParameter(tupleArgs, frame)), ...); }, t);
        }
        else if constexpr (is_same_v<ParamType, bool>) {
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1));
            buffer[encodeBufferIndex++] = static_cast<byte>(t ? msg::CodedType::booleanTrue : msg::CodedType::booleanFalse);
            incrementPayloadSize(1);
            std::cout << "-> encoded to bool of size " << 1 << " in a span.";
        }
        else if constexpr (is_arithmetic_v<ParamType>) {
            double number = t;
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1 + sizeof(number)));
            buffer[encodeBufferIndex++] = static_cast<byte>(msg::CodedType::number);
            copy_n(reinterpret_cast<const byte*>(&number), sizeof(number), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(number);
            incrementPayloadSize(1 + sizeof(number));
            std::cout << "-> encoded to number of size " << sizeof(number) << " in a span.";
        }

        else if constexpr (is_array_v<ParamType>) {
            using ElementType = remove_all_extents_t<ParamType>;
            //   cout << "Array of " << typeName<ElementType>() << "\n";
            //   cout << typeName<ParamType>() << " is bounded : " << is_bounded_array_v<ParamType> << "\n";
            if constexpr (is_same_v<ElementType, char>) {
                if constexpr (is_bounded_array_v<ParamType>)
                    encodeString(t, extent_v<ParamType> - 1);
                else
                    encodeString(t, char_traits<char>::length(t));
            }
            else
                static_assert(is_same_v<ElementType, char>, "Arrays are not supported by JSFunction");
        }
        else if constexpr (is_same_v<ParamType, const char*>)
            encodeString(t, char_traits<char>::length(t));

        else if constexpr (is_same_v<ParamType, string> or is_same_v<ParamType, string_view>)
            encodeString(t.data(), t.size());

        else if constexpr (is_pointer_v<ParamType>)
            static_assert(!is_pointer_v<ParamType>, "Pointers cannot be used by JSFunction");

        else if constexpr (is_base_of_v<std::exception, ParamType>) {
            std::cout << "Exception : " << t.what() << '\n';
            auto textSize = char_traits<char>::length(t.what());
            encodeType(msg::CodedType::exception, static_cast<uint16_t>(textSize), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(t.what()), textSize));
            incrementPayloadSize(textSize);
        }

        std::cout << "bufferIndex = " << encodeBufferIndex << " ,payloadSize = " << getPayloadSize() << "\n";
    }